

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RunLength.cc
# Opt level: O1

void __thiscall Pl_RunLength::~Pl_RunLength(Pl_RunLength *this)

{
  Members *__ptr;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_RunLength_002ef7a8;
  __ptr = (this->m)._M_t.
          super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>.
          _M_t.
          super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
          .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
  if (__ptr != (Members *)0x0) {
    std::default_delete<Pl_RunLength::Members>::operator()
              ((default_delete<Pl_RunLength::Members> *)&this->m,__ptr);
  }
  (this->m)._M_t.
  super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>._M_t.
  super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>.
  super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl = (Members *)0x0;
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002ef068;
  pcVar1 = (this->super_Pipeline).identifier._M_dataplus._M_p;
  paVar2 = &(this->super_Pipeline).identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Pl_RunLength::~Pl_RunLength() // NOLINT (modernize-use-equals-default)
{
    // Must be explicit and not inline -- see QPDF_DLL_CLASS in README-maintainer
}